

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_add_filter_by_name.c
# Opt level: O0

void test_filter_by_name(char *filter_name,int filter_code,_func_int *can_filter_prog)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  void *__ptr;
  archive *paVar4;
  char *pcVar5;
  archive_entry *entry;
  code *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int r;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff98;
  archive_entry *paVar6;
  void *buff_00;
  archive *paVar7;
  archive_entry **entry_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar8;
  uint in_stack_ffffffffffffffa4;
  wchar_t in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *file;
  void *in_stack_ffffffffffffffd0;
  wchar_t utf8;
  
  file = (char *)0x20000;
  __ptr = calloc(1,0x20000);
  assertion_assert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
  if (__ptr == (void *)0x0) {
    return;
  }
  paVar4 = archive_write_new();
  assertion_assert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
  archive_write_set_format_ustar
            ((archive *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  paVar7 = paVar4;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (longlong)paVar4,(char *)0x13ce41,in_stack_ffffffffffffffd0);
  iVar1 = archive_write_add_filter_by_name
                    ((archive *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (iVar1 == -0x14) {
    iVar2 = (*in_RDX)();
    utf8 = (wchar_t)in_RDX;
    if (iVar2 == 0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                     ,L'3');
      wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
      test_skipping("%s filter not suported on this platform",in_RDI);
      archive_write_free((archive *)0x13ce92);
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),0,
                          (char *)0x13cec0,in_stack_ffffffffffffffd0);
      free(__ptr);
      return;
    }
  }
  else {
    if (iVar1 == -0x1e) {
      pcVar5 = archive_error_string(paVar4);
      iVar2 = strcmp(pcVar5,"lzma compression not supported on this platform");
      if (iVar2 == 0) {
LAB_0013cf1b:
        wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                       ,L'>');
        test_skipping("%s filter not suported on this platform",in_RDI);
        archive_write_free((archive *)0x13cf49);
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),0,
                            (char *)0x13cf77,in_stack_ffffffffffffffd0);
        free(__ptr);
        return;
      }
      pcVar5 = archive_error_string(paVar4);
      iVar2 = strcmp(pcVar5,"xz compression not supported on this platform");
      if (iVar2 == 0) goto LAB_0013cf1b;
    }
    utf8 = (wchar_t)in_RDX;
    paVar7 = paVar4;
    wVar3 = assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                                (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),(longlong)paVar4,(char *)0x13cfb7,
                                in_stack_ffffffffffffffd0);
    if (wVar3 == L'\0') {
      archive_write_free((archive *)0x13cfc6);
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                          (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),0,
                          (char *)0x13cff4,in_stack_ffffffffffffffd0);
      free(__ptr);
      return;
    }
  }
  if (in_ESI == 10) {
    archive_write_set_options
              ((archive *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)paVar7);
    assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                        (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (longlong)paVar4,(char *)0x13d04e,in_stack_ffffffffffffffd0);
  }
  archive_write_set_bytes_per_block
            ((archive *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa4);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (longlong)paVar4,(char *)0x13d08c,in_stack_ffffffffffffffd0);
  archive_write_open_memory
            ((archive *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (size_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  paVar7 = paVar4;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (longlong)paVar4,(char *)0x13d0d4,in_stack_ffffffffffffffd0);
  entry = archive_entry_new();
  assertion_assert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),paVar7);
  archive_entry_set_mtime(entry,1,0);
  archive_entry_mtime(entry);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),0,
                      (char *)0x13d155,in_stack_ffffffffffffffd0);
  archive_entry_set_ctime(entry,1,0);
  archive_entry_ctime(entry);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),0,
                      (char *)0x13d1a3,in_stack_ffffffffffffffd0);
  archive_entry_set_atime(entry,1,0);
  archive_entry_atime(entry);
  paVar6 = (archive_entry *)0x0;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),0,
                      (char *)0x13d1f1,in_stack_ffffffffffffffd0);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (char *)paVar6);
  archive_entry_pathname(paVar6);
  uVar8 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)__ptr >> 0x20),(char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)((ulong)in_stack_ffffffffffffffa4 << 0x20),entry,utf8);
  archive_entry_set_mode(entry,0x81ed);
  archive_entry_mode(entry);
  paVar6 = (archive_entry *)0x0;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d295,
                      in_stack_ffffffffffffffd0);
  archive_entry_set_size(entry,8);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),paVar6);
  buff_00 = (void *)0x0;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d2e1,
                      in_stack_ffffffffffffffd0);
  archive_entry_free((archive_entry *)0x13d2eb);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),buff_00,0x13d301);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d332,
                      in_stack_ffffffffffffffd0);
  archive_write_close((archive *)0x13d33c);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d36b,in_stack_ffffffffffffffd0);
  archive_write_free((archive *)0x13d375);
  paVar7 = (archive *)0x0;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d3a3,
                      in_stack_ffffffffffffffd0);
  paVar4 = archive_read_new();
  assertion_assert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),paVar7);
  archive_read_support_format_all(paVar7);
  paVar7 = paVar4;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d40f,in_stack_ffffffffffffffd0);
  archive_read_support_filter_all(paVar7);
  paVar7 = paVar4;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d448,in_stack_ffffffffffffffd0);
  archive_read_open_memory((archive *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),paVar7,0x13d45c);
  paVar7 = paVar4;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d48b,in_stack_ffffffffffffffd0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(archive_entry **)paVar7);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d4c9,in_stack_ffffffffffffffd0);
  archive_entry_mtime(entry);
  paVar6 = (archive_entry *)0x0;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d504,
                      in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar6);
  uVar8 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)__ptr >> 0x20),(char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)((ulong)in_stack_ffffffffffffffa4 << 0x20),entry,utf8);
  wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  archive_entry_filetype(entry);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d588,
                      in_stack_ffffffffffffffd0);
  archive_entry_size(entry);
  entry_00 = (archive_entry **)0x0;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d5c3,
                      in_stack_ffffffffffffffd0);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),entry_00);
  paVar7 = paVar4;
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d602,in_stack_ffffffffffffffd0);
  wVar3 = in_ESI >> 0x1f;
  archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),
                      (int)((ulong)paVar7 >> 0x20));
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d648,in_stack_ffffffffffffffd0);
  archive_format(paVar4);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),(longlong)paVar4,
                      (char *)0x13d682,in_stack_ffffffffffffffd0);
  archive_read_close((archive *)0x13d68c);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d6ba,
                      in_stack_ffffffffffffffd0);
  archive_read_free((archive *)0x13d6c4);
  assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),wVar3,
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar8),0,(char *)0x13d6f2,
                      in_stack_ffffffffffffffd0);
  free(__ptr);
  return;
}

Assistant:

static void
test_filter_by_name(const char *filter_name, int filter_code,
    int (*can_filter_prog)(void))
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 128;
	char *buff;
	int r;

	assert((buff = calloc(1, buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_by_name(a, filter_name);
	if (r == ARCHIVE_WARN) {
		if (!can_filter_prog()) {
			skipping("%s filter not suported on this platform",
			    filter_name);
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	} else if (r == ARCHIVE_FATAL &&
	    (strcmp(archive_error_string(a),
		   "lzma compression not supported on this platform") == 0 ||
	     strcmp(archive_error_string(a),
		   "xz compression not supported on this platform") == 0)) {
		skipping("%s filter not suported on this platform", filter_name);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	} else {
		if (!assertEqualIntA(a, ARCHIVE_OK, r)) {
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	}
	if (filter_code == ARCHIVE_FILTER_LRZIP)
	{
		/*
		 * There's a bug in lrzip (as of release 0.612) where 2nd stage
		 * compression can't be performed on smaller files. Set lrzip to
		 * use no 2nd stage compression.
		 */
		assertEqualIntA(a, ARCHIVE_OK,
			archive_write_set_options(a, "lrzip:compression=none"));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/*
	 * Read and verify the file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(8, archive_entry_size(ae));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, filter_code, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_USTAR, archive_format(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(buff);
}